

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_5292d::FileSystemRootNode::get_directory_entries
          (FileSystemRootNode *this,string *path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [39];
  allocator local_b1;
  string local_b0 [8];
  string current;
  dirent *local_90;
  dirent *entry;
  string local_80 [32];
  DIR *local_60;
  DIR *dir;
  string local_48 [8];
  string dirname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  string *path_local;
  FileSystemRootNode *this_local;
  
  std::__cxx11::string::string(local_48,(string *)path);
  std::__cxx11::string::length();
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
  if (*pcVar3 != '/') {
    std::__cxx11::string::operator+=(local_48,"/");
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_60 = opendir(pcVar3);
  if (local_60 == (DIR *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"OS",(allocator *)((long)&entry + 7));
    poVar4 = GEO::Logger::err((string *)local_80);
    poVar4 = std::operator<<(poVar4,"Could not open directory ");
    poVar4 = std::operator<<(poVar4,local_48);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&entry + 7));
    this_local._7_1_ = false;
  }
  else {
    local_90 = readdir(local_60);
    while (local_90 != (dirent *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,local_90->d_name,&local_b1);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,".");
      if ((bVar1) &&
         (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b0,".."), bVar1)) {
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"./");
        if (bVar1) {
          std::operator+(local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48);
          std::__cxx11::string::operator=(local_b0,(string *)local_d8);
          std::__cxx11::string::~string((string *)local_d8);
        }
        uVar2 = (*(this->super_Node).super_Counted._vptr_Counted[2])(this,local_b0);
        if (((uVar2 & 1) != 0) ||
           (uVar2 = (*(this->super_Node).super_Counted._vptr_Counted[3])(this,local_b0),
           (uVar2 & 1) != 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(result,(value_type *)local_b0);
        }
      }
      local_90 = readdir(local_60);
      std::__cxx11::string::~string(local_b0);
    }
    closedir(local_60);
    this_local._7_1_ = true;
  }
  entry._0_4_ = 1;
  std::__cxx11::string::~string(local_48);
  return this_local._7_1_;
}

Assistant:

bool get_directory_entries(
            const std::string& path, std::vector<std::string>& result
        ) override {
            std::string dirname = path;
            if(dirname[dirname.length() - 1] != '/') {
                dirname += "/";
            }
            DIR* dir = opendir(dirname.c_str());
            if(dir == nullptr) {
                Logger::err("OS")
                    << "Could not open directory " << dirname
                    << std::endl;
#ifdef GEO_OS_ANDROID
		static bool first_time = true;
		if(first_time) {
		    Logger::err("OS")
			<< "You may need to grant the \"Storage\" permission"
			<< std::endl
			<< "to this application"
			<< std::endl;
		    Logger::err("OS")
			<< "(see Parameters/Applications"
			<< std::endl
			<< "in Android perferences)"
			<< std::endl;
		    first_time = false;
		}
#endif		
                return false;
            }
            struct dirent* entry = readdir(dir);
            while(entry != nullptr) {
                std::string current = std::string(entry->d_name);
                // Ignore . and ..
                if(current != "." && current != "..") {
                    if(dirname != "./") {
                        current = dirname + current;
                    }
                    // Ignore symbolic links and other special Unix stuff
                    if(is_file(current) || is_directory(current)) {
                        result.push_back(current);
                    }
                }
                entry = readdir(dir);
            }
            closedir(dir);
            return true;
        }